

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

void __thiscall
solitaire::Solitaire::saveHistoryIfCardMovedToOtherPileAndClearHand
          (Solitaire *this,optional<solitaire::cards::Card> *cardToAdd,
          SnapshotPtr *destinationPileSnapshot)

{
  bool bVar1;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  local_28;
  SnapshotPtr *local_20;
  SnapshotPtr *destinationPileSnapshot_local;
  optional<solitaire::cards::Card> *cardToAdd_local;
  Solitaire *this_local;
  
  local_20 = destinationPileSnapshot;
  destinationPileSnapshot_local = (SnapshotPtr *)cardToAdd;
  cardToAdd_local = (optional<solitaire::cards::Card> *)this;
  bVar1 = isCardAdded(this,cardToAdd);
  if (bVar1) {
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::unique_ptr(&local_28,destinationPileSnapshot);
    saveHistoryIfCardMovedToOtherPile(this,&local_28);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::~unique_ptr(&local_28);
    std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::clear
              (&this->cardsInHand);
  }
  return;
}

Assistant:

void Solitaire::saveHistoryIfCardMovedToOtherPileAndClearHand(
    const std::optional<Card>& cardToAdd, SnapshotPtr destinationPileSnapshot)
{
    if (isCardAdded(cardToAdd)) {
        saveHistoryIfCardMovedToOtherPile(std::move(destinationPileSnapshot));
        cardsInHand.clear();
    }
}